

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O3

void __thiscall ipx::IPM::AddCorrector(IPM *this,Step *step)

{
  double dVar1;
  double dVar2;
  Iterate *this_00;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  pointer pSVar9;
  Iterate *this_01;
  double *pdVar10;
  double *pdVar11;
  Vector *pVVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_40;
  
  this_00 = this->iterate_;
  iVar18 = this_00->model_->num_rows_;
  iVar14 = this_00->model_->num_cols_;
  dVar20 = Iterate::mu(this_00);
  pdVar10 = (this_00->xl_)._M_data;
  pdVar11 = (step->xl)._M_data;
  dVar21 = 1.0;
  dVar23 = 1.0;
  uVar13 = (uint)(this_00->xl_)._M_size;
  if (0 < (int)uVar13) {
    uVar15 = 0;
    dVar23 = 1.0;
    do {
      dVar22 = pdVar10[uVar15];
      dVar24 = pdVar11[uVar15];
      uVar19 = -(ulong)(dVar23 * dVar24 + dVar22 < 0.0);
      dVar23 = (double)(~uVar19 & (ulong)dVar23 |
                       (ulong)((dVar22 * -0.9999999999999998) / dVar24) & uVar19);
      uVar15 = uVar15 + 1;
    } while ((uVar13 & 0x7fffffff) != uVar15);
  }
  pdVar3 = (this_00->xu_)._M_data;
  pdVar4 = (step->xu)._M_data;
  dVar22 = 1.0;
  uVar13 = (uint)(this_00->xu_)._M_size;
  if (0 < (int)uVar13) {
    uVar15 = 0;
    dVar22 = 1.0;
    do {
      dVar24 = pdVar3[uVar15];
      dVar1 = pdVar4[uVar15];
      uVar19 = -(ulong)(dVar22 * dVar1 + dVar24 < 0.0);
      dVar22 = (double)(~uVar19 & (ulong)dVar22 |
                       (ulong)((dVar24 * -0.9999999999999998) / dVar1) & uVar19);
      uVar15 = uVar15 + 1;
    } while ((uVar13 & 0x7fffffff) != uVar15);
  }
  pdVar5 = (this_00->zl_)._M_data;
  pdVar6 = (step->zl)._M_data;
  dVar24 = 1.0;
  uVar13 = (uint)(this_00->zl_)._M_size;
  if (0 < (int)uVar13) {
    uVar15 = 0;
    dVar24 = 1.0;
    do {
      dVar1 = pdVar5[uVar15];
      dVar2 = pdVar6[uVar15];
      uVar19 = -(ulong)(dVar24 * dVar2 + dVar1 < 0.0);
      dVar24 = (double)(~uVar19 & (ulong)dVar24 |
                       (ulong)((dVar1 * -0.9999999999999998) / dVar2) & uVar19);
      uVar15 = uVar15 + 1;
    } while ((uVar13 & 0x7fffffff) != uVar15);
  }
  pdVar7 = (this_00->zu_)._M_data;
  pdVar8 = (step->zu)._M_data;
  uVar13 = (uint)(this_00->zu_)._M_size;
  if (0 < (int)uVar13) {
    uVar15 = 0;
    dVar21 = 1.0;
    do {
      dVar1 = pdVar7[uVar15];
      dVar2 = pdVar8[uVar15];
      uVar19 = -(ulong)(dVar21 * dVar2 + dVar1 < 0.0);
      dVar21 = (double)(~uVar19 & (ulong)dVar21 |
                       (ulong)((dVar1 * -0.9999999999999998) / dVar2) & uVar19);
      uVar15 = uVar15 + 1;
    } while ((uVar13 & 0x7fffffff) != uVar15);
  }
  uVar19 = (long)iVar14 + (long)iVar18;
  iVar18 = (int)uVar19;
  uVar15 = uVar19 & 0xffffffff;
  if (iVar18 < 1) {
    local_40 = NAN;
  }
  else {
    if (dVar23 <= dVar22) {
      dVar22 = dVar23;
    }
    if (dVar24 <= dVar21) {
      dVar21 = dVar24;
    }
    lVar17 = 0;
    local_40 = 0.0;
    iVar14 = 0;
    do {
      uVar13 = *(uint *)((long)(this->iterate_->variable_state_).
                               super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar17);
      if ((uVar13 & 0xfffffffd) == 0) {
        local_40 = local_40 +
                   (*(double *)((long)pdVar6 + lVar17 * 2) * dVar21 +
                   *(double *)((long)pdVar5 + lVar17 * 2)) *
                   (*(double *)((long)pdVar11 + lVar17 * 2) * dVar22 +
                   *(double *)((long)pdVar10 + lVar17 * 2));
        iVar14 = iVar14 + 1;
      }
      if (uVar13 - 1 < 2) {
        local_40 = local_40 +
                   (*(double *)((long)pdVar8 + lVar17 * 2) * dVar21 +
                   *(double *)((long)pdVar7 + lVar17 * 2)) *
                   (*(double *)((long)pdVar4 + lVar17 * 2) * dVar22 +
                   *(double *)((long)pdVar3 + lVar17 * 2));
        iVar14 = iVar14 + 1;
      }
      lVar17 = lVar17 + 4;
    } while (uVar15 * 4 - lVar17 != 0);
    local_40 = local_40 / (double)iVar14;
  }
  uVar19 = uVar19 * 8;
  pdVar10 = (double *)operator_new(uVar19);
  memset(pdVar10,0,uVar19);
  local_40 = local_40 / dVar20;
  dVar20 = local_40 * local_40 * local_40 * dVar20;
  if (0 < iVar18) {
    pSVar9 = (this->iterate_->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar11 = (step->xl)._M_data;
    pdVar3 = (step->zl)._M_data;
    uVar16 = 0;
    do {
      dVar21 = 0.0;
      if ((pSVar9[uVar16] & ~BARRIER_BOXED) == BARRIER_LB) {
        dVar21 = (dVar20 - (this_00->xl_)._M_data[uVar16] * (this_00->zl_)._M_data[uVar16]) -
                 pdVar11[uVar16] * pdVar3[uVar16];
      }
      pdVar10[uVar16] = dVar21;
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  pdVar11 = (double *)operator_new(uVar19);
  memset(pdVar11,0,uVar19);
  this_01 = this->iterate_;
  if (0 < iVar18) {
    pSVar9 = (this_01->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (step->xu)._M_data;
    pdVar4 = (step->zu)._M_data;
    uVar19 = 0;
    do {
      dVar21 = 0.0;
      if (pSVar9[uVar19] - BARRIER_UB < 2) {
        dVar21 = (dVar20 - (this_00->xu_)._M_data[uVar19] * (this_00->zu_)._M_data[uVar19]) -
                 pdVar3[uVar19] * pdVar4[uVar19];
      }
      pdVar11[uVar19] = dVar21;
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
  }
  pVVar12 = Iterate::rb(this_01);
  pdVar3 = pVVar12->_M_data;
  pVVar12 = Iterate::rc(this->iterate_);
  pdVar4 = pVVar12->_M_data;
  pVVar12 = Iterate::rl(this->iterate_);
  pdVar5 = pVVar12->_M_data;
  pVVar12 = Iterate::ru(this->iterate_);
  SolveNewtonSystem(this,pdVar3,pdVar4,pdVar5,pVVar12->_M_data,pdVar10,pdVar11,step);
  operator_delete(pdVar11);
  operator_delete(pdVar10);
  return;
}

Assistant:

void IPM::AddCorrector(Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    const Vector& dxl = step.xl;
    const Vector& dxu = step.xu;
    const Vector& dzl = step.zl;
    const Vector& dzu = step.zu;
    const double mu = iterate_->mu();

    // Choose centering parameter.
    double step_xl = StepToBoundary(xl, dxl, nullptr);
    double step_xu = StepToBoundary(xu, dxu, nullptr);
    double step_zl = StepToBoundary(zl, dzl, nullptr);
    double step_zu = StepToBoundary(zu, dzu, nullptr);
    double maxp = std::min(step_xl, step_xu);
    double maxd = std::min(step_zl, step_zu);
    double muaff = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->has_barrier_lb(j)) {
            assert(std::isfinite(xl[j]));
            assert(xl[j] != 0.0);
            muaff += (xl[j]+maxp*dxl[j]) * (zl[j]+maxd*dzl[j]);
            num_finite++;
        }
        if (iterate_->has_barrier_ub(j)) {
            assert(std::isfinite(xu[j]));
            assert(xu[j] != 0.0);
            muaff += (xu[j]+maxp*dxu[j]) * (zu[j]+maxd*dzu[j]);
            num_finite++;
        }
    }
    assert(std::isfinite(muaff));
    muaff /= num_finite;
    double ratio = muaff / mu;
    double sigma = ratio * ratio * ratio;

    // sl = -xl.*zl + sigma*mu - dxl.*dzl
    Vector sl(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_lb(j))
            sl[j] = -xl[j]*zl[j] + sigma*mu - dxl[j]*dzl[j];
        else
            sl[j] = 0.0;
    assert(AllFinite(sl));

    // su = -xu.*zu + sigma*mu - dxu.*dzu
    Vector su(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_ub(j))
            su[j] = -xu[j]*zu[j] + sigma*mu - dxu[j]*dzu[j];
        else
            su[j] = 0.0;
    assert(AllFinite(su));

    SolveNewtonSystem(&iterate_->rb()[0], &iterate_->rc()[0],
                      &iterate_->rl()[0], &iterate_->ru()[0], &sl[0], &su[0],
                      step);
}